

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
CartesianProductGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::~IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
  _Var1;
  tuple<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  tVar2;
  
  (this->
  super_ParamIteratorInterface<std::tuple<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_0105ec58;
  this_00 = (this->current_value_).
            super___shared_ptr<std::tuple<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  _Var1.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
  ._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
  ;
  if (_Var1.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
      ._M_head_impl !=
      (ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)> *
      )0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
          )0x0;
  tVar2.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>.
  _M_head_impl = *(_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                   *)&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Tuple_impl<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Head_base<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>
                      ._M_head_impl.impl_._M_t.
                      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  ;
  if (tVar2.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
      ._M_head_impl !=
      (_Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>)
      0x0) {
    (**(code **)(*(long *)tVar2.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  .super__Tuple_impl<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>.
  super__Head_base<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>._M_head_impl
  .impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
       = (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
          )0x0;
  _Var1.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
  ._M_head_impl =
       (this->end_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
  ;
  if (_Var1.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
      ._M_head_impl !=
      (ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)> *
      )0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
          )0x0;
  tVar2.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>.
  _M_head_impl = *(_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                   *)&(this->end_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Tuple_impl<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Head_base<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>
                      ._M_head_impl.impl_._M_t.
                      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  ;
  if (tVar2.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
      ._M_head_impl !=
      (_Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>)
      0x0) {
    (**(code **)(*(long *)tVar2.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  .super__Tuple_impl<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>.
  super__Head_base<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>._M_head_impl
  .impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
       = (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
          )0x0;
  _Var1.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
  ._M_head_impl =
       (this->begin_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
  ;
  if (_Var1.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
      ._M_head_impl !=
      (ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)> *
      )0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
          )0x0;
  tVar2.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>.
  _M_head_impl = *(_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                   *)&(this->begin_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Tuple_impl<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Head_base<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>
                      ._M_head_impl.impl_._M_t.
                      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  ;
  if (tVar2.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
      ._M_head_impl !=
      (_Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>)
      0x0) {
    (**(code **)(*(long *)tVar2.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  .super__Tuple_impl<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>.
  super__Head_base<1UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>._M_head_impl
  .impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
       = (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
          )0x0;
  return;
}

Assistant:

~IteratorImpl() override {}